

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlebsdf.cpp
# Opt level: O0

Color __thiscall SingleBSDF::f(SingleBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  undefined8 *puVar1;
  vec3f *in_RCX;
  vec3f *in_RDX;
  vec3f *in_RSI;
  long in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  Color CVar5;
  Type allowed;
  bool through;
  vec3f wiL;
  vec3f woL;
  vec3f N2;
  vec3f N1;
  vec2f *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 local_88;
  undefined8 local_78;
  float local_70;
  uint local_68;
  undefined1 local_61;
  vec3f local_60;
  vec3f local_54;
  vec3f local_48;
  vec3f local_3c;
  vec3f local_c;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    vec3f::vec3f(&local_c,0.0);
  }
  else {
    vec3f::vec3f(&local_3c);
    vec3f::vec3f(&local_48);
    BSDF::getLocalBasis(in_RSI,in_RDX,in_RCX);
    fVar2 = dot(in_RSI,&local_3c);
    fVar3 = dot(in_RSI,&local_48);
    fVar4 = dot(in_RSI,(vec3f *)&in_RCX[1].y);
    vec3f::vec3f(&local_54,fVar2,fVar3,fVar4);
    fVar2 = dot(in_RDX,&local_3c);
    fVar3 = dot(in_RDX,&local_48);
    fVar4 = dot(in_RDX,(vec3f *)&in_RCX[1].y);
    vec3f::vec3f(&local_60,fVar2,fVar3,fVar4);
    fVar2 = dot(in_RSI,(vec3f *)&in_RCX[2].y);
    fVar3 = dot(in_RDX,(vec3f *)&in_RCX[2].y);
    local_61 = 0.0 < fVar2 != 0.0 < fVar3;
    local_68 = 2;
    if ((bool)local_61) {
      local_68 = 4;
    }
    if ((*(uint *)(*(long *)(in_RDI + 0x28) + 8) & local_68) == 0) {
      vec3f::vec3f(&local_c,0.0);
    }
    else {
      puVar1 = *(undefined8 **)(in_RDI + 0x28);
      CVar5 = BSDF::albedo((BSDF *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff68);
      fVar2 = CVar5.z;
      local_88 = CVar5._0_8_;
      local_78 = local_88;
      local_70 = fVar2;
      local_c._0_8_ = (**(code **)*puVar1)(puVar1,&local_78,&local_54,&local_60);
      local_c.z = fVar2;
    }
  }
  CVar5.z = local_c.z;
  CVar5.x = local_c.x;
  CVar5.y = local_c.y;
  return CVar5;
}

Assistant:

Color SingleBSDF::f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
{
	if (component == NULL) return Color(0);
	vec3f N1,N2;
	getLocalBasis(hit.Ns, N1, N2);
	// transform wo, wi to local surface Ns' = (0,0,1)
	vec3f woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
	vec3f wiL = vec3f(dot(wi,N1), dot(wi,N2), dot(wi,hit.Ns));
	// use Ng to determine whether BRDF or BTDF is used
	bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
	BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
	return (component->flags & allowed)? component->f(albedo(hit.uv), woL, wiL): 0;
}